

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O2

void skiwi::allocate_buffer_as_string(asmcode *code)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  operand oVar2;
  operand oVar3;
  operand local_80;
  operand local_7c;
  operand local_78 [2];
  string done;
  string fill;
  
  fill._M_dataplus._M_p._0_4_ = 0x4b;
  done._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&fill,(operand *)&done);
  fill._M_dataplus._M_p._0_4_ = 0x40;
  local_80 = MEM_R10;
  local_7c = 0xc0;
  done._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&fill,(operand *)&done,&local_80,(int *)&local_7c);
  fill._M_dataplus._M_p = fill._M_dataplus._M_p & 0xffffffff00000000;
  local_80 = RAX;
  done._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&fill,(operand *)&done,&local_80);
  fill._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x24;
  local_80 = NUMBER;
  local_7c = EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&fill,(operand *)&done,&local_80,(int *)&local_7c);
  fill._M_dataplus._M_p._0_4_ = 0x56;
  oVar2 = RAX;
  local_80 = NUMBER;
  local_7c = BL;
  done._M_dataplus._M_p._0_4_ = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&fill,(operand *)&done,&local_80,(int *)&local_7c);
  fill._M_dataplus._M_p._0_4_ = 0x2b;
  done._M_dataplus._M_p._0_4_ = oVar2;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&fill,(operand *)&done);
  fill._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0xb;
  local_80 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&fill,(operand *)&done,&local_80);
  oVar3 = R15;
  local_7c = NUMBER;
  fill._M_dataplus._M_p = (pointer)0x200000000000000;
  local_80 = oVar3;
  done._M_dataplus._M_p._0_4_ = 0x40;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&done,&local_80,&local_7c,(unsigned_long *)&fill);
  fill._M_dataplus._M_p._0_4_ = 0x49;
  local_80 = oVar3;
  done._M_dataplus._M_p._0_4_ = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&fill,(operand *)&done,&local_80);
  fill._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x20;
  local_80 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&fill,(operand *)&done,&local_80);
  fill._M_dataplus._M_p._0_4_ = 0x40;
  local_80 = RBP;
  done._M_dataplus._M_p._0_4_ = oVar3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&fill,(operand *)&done,&local_80);
  fill._M_dataplus._M_p._0_4_ = 0x49;
  local_7c = CL;
  local_80 = NUMBER;
  done._M_dataplus._M_p._0_4_ = oVar3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&fill,(operand *)&done,&local_80,(int *)&local_7c);
  fill._M_dataplus._M_p = fill._M_dataplus._M_p & 0xffffffff00000000;
  done._M_dataplus._M_p._0_4_ = 0x10;
  local_7c = DH;
  local_80 = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&fill,(operand *)&done,&local_80,(int *)&local_7c);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&fill,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&done,psVar1,lab_00);
  local_80 = ST6;
  local_7c = R11;
  local_78[0] = MEM_R10;
  local_78[1] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_80,&local_7c,local_78,(int *)(local_78 + 1));
  local_80 = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,&local_80,&fill)
  ;
  local_80 = ST6;
  local_7c = RAX;
  local_78[0] = MEM_R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_80,&local_7c,local_78);
  local_80 = ST6;
  local_7c = MEM_RBP;
  local_78[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_80,&local_7c,local_78);
  local_80 = EMPTY;
  local_7c = R11;
  local_78[0] = NUMBER;
  local_78[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_80,&local_7c,local_78,(int *)(local_78 + 1));
  local_80 = EMPTY;
  local_7c = RBP;
  local_78[0] = NUMBER;
  local_78[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_80,&local_7c,local_78,(int *)(local_78 + 1));
  local_80 = RSI;
  local_7c = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_80,&local_7c);
  local_80 = XMM13|RBX;
  local_7c = RCX;
  local_78[0] = local_7c;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_80,&local_7c,local_78);
  local_80 = BYTE_MEM_R15;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,&local_80,&done)
  ;
  local_80 = BYTE_MEM_R12;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,&local_80,&fill)
  ;
  local_80 = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,&local_80,&done)
  ;
  local_80 = XMM7;
  local_7c = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_80,&local_7c);
  local_80 = ST6;
  local_7c = RAX;
  local_78[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_80,&local_7c,local_78);
  std::__cxx11::string::~string((string *)&done);
  std::__cxx11::string::~string((string *)&fill);
  return;
}

Assistant:

void allocate_buffer_as_string(asmcode& code)
  {
  // assumptions:
  // input: buffer is in BUFFER
  //        size of string is in rax
  // output: result is in rax
  // clobbers r11 and r15
  // does not check the heap
  code.add(asmcode::PUSH, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::R11, BUFFER);
  code.add(asmcode::ADD, asmcode::R11, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::MEM_R11, asmcode::NUMBER, 0); // make closing zeros at end of string in buffer
  code.add(asmcode::SHR, asmcode::RAX, asmcode::NUMBER, 3);
  code.add(asmcode::INC, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::RCX, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, (uint64_t)string_tag << (uint64_t)block_shift);
  code.add(asmcode::OR, asmcode::RAX, asmcode::R15);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R15, ALLOC);
  code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(1));

  std::string fill = label_to_string(label++);
  std::string done = label_to_string(label++);

  code.add(asmcode::MOV, asmcode::R11, BUFFER);
  

  code.add(asmcode::LABEL, fill);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_R11);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::ADD, asmcode::R11, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::RCX);
  code.add(asmcode::TEST, asmcode::RCX, asmcode::RCX);
  code.add(asmcode::JES, done);
  code.add(asmcode::JMPS, fill);
  code.add(asmcode::LABEL, done);

  code.add(asmcode::POP, asmcode::RCX);

  code.add(asmcode::MOV, asmcode::RAX, asmcode::R15);
  }